

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O0

void __thiscall CLIListener::do_discover(CLIListener *this,Poll *p)

{
  _Head_base<0UL,_CLIListener_*,_false> *this_00;
  uint64_t cmd_seq;
  element_type *peVar1;
  OnTimeout local_1a0;
  OnError local_180;
  CLIListener *local_160;
  code *local_158;
  undefined8 local_150;
  type local_148;
  OnResponse local_130;
  reference_wrapper<Poll> local_110;
  CLIListener *local_108;
  code *local_100;
  undefined8 local_f8;
  undefined1 local_f0 [8];
  type unblock;
  undefined1 local_b8 [8];
  shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> query;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  Simple dto;
  string empty;
  Poll *p_local;
  CLIListener *this_local;
  
  block_input(this,p);
  std::__cxx11::string::string((string *)(dto.payload.field_2._M_local_buf + 8));
  cmd_seq = this->cmd_seq;
  this->cmd_seq = cmd_seq + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"HELLO",&local_91);
  ::dto::create((Simple *)local_70,cmd_seq,&local_90,(string *)((long)&dto.payload.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::
  make_shared<MultiQuery<dto::Simple,dto::Complex>,dto::Simple&,unsigned_short&,std::__cxx11::string&,int>
            ((Simple *)local_b8,(unsigned_short *)local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->port,
             (int *)&this->mcast_addr);
  this_00 = &unblock._M_bound_args.
             super__Tuple_impl<0UL,_CLIListener_*,_std::reference_wrapper<Poll>_>.
             super__Head_base<0UL,_CLIListener_*,_false>;
  std::shared_ptr<Subscriber>::shared_ptr<MultiQuery<dto::Simple,dto::Complex>,void>
            ((shared_ptr<Subscriber> *)this_00,
             (shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> *)local_b8);
  Poll::subscribe(p,(shared_ptr<Subscriber> *)this_00);
  std::shared_ptr<Subscriber>::~shared_ptr
            ((shared_ptr<Subscriber> *)
             &unblock._M_bound_args.
              super__Tuple_impl<0UL,_CLIListener_*,_std::reference_wrapper<Poll>_>.
              super__Head_base<0UL,_CLIListener_*,_false>);
  local_100 = unblock_input;
  local_f8 = 0;
  local_108 = this;
  local_110 = std::ref<Poll>(p);
  std::bind<void(CLIListener::*)(Poll&),CLIListener*,std::reference_wrapper<Poll>>
            ((type *)local_f0,(offset_in_CLIListener_to_subr *)&local_100,&local_108,&local_110);
  peVar1 = std::
           __shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b8);
  local_158 = on_discover_result;
  local_150 = 0;
  local_160 = this;
  std::
  bind<void(CLIListener::*)(dto::Complex&,sockaddr_in),CLIListener*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_148,(offset_in_CLIListener_to_subr *)&local_158,&local_160,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  std::function<void(dto::Complex&,sockaddr_in)>::
  function<std::_Bind<void(CLIListener::*(CLIListener*,std::_Placeholder<1>,std::_Placeholder<2>))(dto::Complex&,sockaddr_in)>,void>
            ((function<void(dto::Complex&,sockaddr_in)> *)&local_130,&local_148);
  MultiQuery<dto::Simple,_dto::Complex>::when_response(peVar1,&local_130);
  std::function<void_(dto::Complex_&,_sockaddr_in)>::~function(&local_130);
  peVar1 = std::
           __shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b8);
  std::function<void()>::
  function<std::_Bind<void(CLIListener::*(CLIListener*,std::reference_wrapper<Poll>))(Poll&)>&,void>
            ((function<void()> *)&local_180,
             (_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>))(Poll_&)> *)
             local_f0);
  MultiQuery<dto::Simple,_dto::Complex>::when_error(peVar1,&local_180);
  std::function<void_()>::~function(&local_180);
  peVar1 = std::
           __shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b8);
  std::function<void()>::
  function<std::_Bind<void(CLIListener::*(CLIListener*,std::reference_wrapper<Poll>))(Poll&)>&,void>
            ((function<void()> *)&local_1a0,
             (_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>))(Poll_&)> *)
             local_f0);
  MultiQuery<dto::Simple,_dto::Complex>::when_timeout(peVar1,&local_1a0);
  std::function<void_()>::~function(&local_1a0);
  std::shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_>::~shared_ptr
            ((shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> *)local_b8);
  ::dto::Simple::~Simple((Simple *)local_70);
  std::__cxx11::string::~string((string *)(dto.payload.field_2._M_local_buf + 8));
  return;
}

Assistant:

void CLIListener::do_discover(Poll &p) {
  block_input(p);
  auto empty = std::string();
  auto dto = dto::create(cmd_seq++, "HELLO", empty);
  auto query = std::make_shared<MultiQuery<dto::Simple, dto::Complex>>(dto, port, mcast_addr, timeout_sec * 1000);
  p.subscribe(query);
  auto unblock = std::bind(&CLIListener::unblock_input, this, std::ref(p));
  query->when_response(std::bind(&CLIListener::on_discover_result, this, _1, _2));
  query->when_error(unblock);
  query->when_timeout(unblock);
}